

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_token_write_folded(fy_emitter *emit,fy_token *fyt,int flags,int indent)

{
  _Bool _Var1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  fy_atom *atom;
  bool bVar7;
  int flags_00;
  char chomp;
  fy_emit_accum *local_220;
  fy_atom_iter iter;
  
  iVar4 = indent;
  fy_emit_write_indicator(emit,di_greater,flags,indent,fyewt_indicator);
  fy_emit_token_write_block_hints(emit,fyt,flags_00,iVar4,&chomp);
  if ((flags & 1U) != 0) {
    uVar3 = emit->cfg->flags >> 8 & 0xf;
    if (uVar3 == 0) {
      uVar3 = 2;
    }
    indent = indent + uVar3;
  }
  fy_emit_putc(emit,fyewt_linebreak,10);
  *(byte *)&emit->flags = (byte)emit->flags | 3;
  atom = fy_token_atom(fyt);
  if (atom == (fy_atom *)0x0) {
    return;
  }
  fy_atom_iter_start(atom,&iter);
  local_220 = &emit->ea;
  fy_emit_accum_start(local_220,fyewt_folded_scalar);
  bVar7 = true;
  _Var2 = true;
  do {
    while( true ) {
      while( true ) {
        iVar4 = fy_atom_iter_utf8_get(&iter);
        if (iVar4 < 1) {
          fy_emit_accum_output(local_220);
          (emit->ea).next = 0;
          (emit->ea).utf8_count = 0;
          (emit->ea).col = (emit->ea).start_col;
          fy_atom_iter_finish(&iter);
          return;
        }
        _Var1 = fy_is_lb(iVar4);
        if (!_Var1) break;
        if ((emit->ea).utf8_count != 0) {
          fy_emit_accum_output(local_220);
          iVar4 = fy_atom_iter_utf8_peek(&iter);
          if (0 < iVar4 && !bVar7) {
            fy_emit_write_indent(emit,indent);
          }
        }
        iVar4 = 1;
        while( true ) {
          iVar5 = fy_atom_iter_utf8_peek(&iter);
          _Var2 = fy_is_lb(iVar5);
          if (!_Var2) break;
          iVar4 = iVar4 + 1;
          fy_atom_iter_utf8_get(&iter);
        }
        uVar3 = (uint)(iVar5 == 9 || iVar5 == 0x20);
        if (iVar5 < 1) {
          uVar3 = 2;
        }
        for (; _Var2 = _Var1, (int)uVar3 < iVar4; iVar4 = iVar4 + -1) {
          *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
          fy_emit_write_indent(emit,indent);
        }
      }
      if (_Var2 == false) break;
      fy_emit_write_indent(emit,indent);
      bVar7 = iVar4 == 9 || iVar4 == 0x20;
LAB_00125ae8:
      fy_emit_accum_utf8_put(local_220,iVar4);
      _Var2 = _Var1;
    }
    if (((iVar4 != 0x20) || (iVar5 = fy_atom_iter_utf8_peek(&iter), iVar5 == 0x20)) ||
       (iVar5 = (emit->ea).col, iVar6 = fy_emit_width(emit), iVar5 <= iVar6)) goto LAB_00125ae8;
    fy_emit_accum_output(local_220);
    *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
    fy_emit_write_indent(emit,indent);
    _Var2 = _Var1;
  } while( true );
}

Assistant:

void fy_emit_token_write_folded(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent) {
    bool leading_spaces, breaks;
    int c, nrbreaks, nrbreakslim;
    char chomp;
    struct fy_atom *atom;
    struct fy_atom_iter iter;

    fy_emit_write_indicator(emit, di_greater, flags, indent, fyewt_indicator);

    fy_emit_token_write_block_hints(emit, fyt, flags, indent, &chomp);
    if (flags & DDNF_ROOT)
        indent += fy_emit_indent(emit);

    fy_emit_putc(emit, fyewt_linebreak, '\n');
    emit->flags |= FYEF_WHITESPACE | FYEF_INDENTATION;

    atom = fy_token_atom(fyt);
    if (!atom)
        return;

    breaks = true;
    leading_spaces = true;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, fyewt_folded_scalar);
    while ((c = fy_atom_iter_utf8_get(&iter)) > 0) {

        if (fy_is_lb(c)) {

            /* output run */
            if (fy_emit_accum_utf8_size(&emit->ea)) {
                fy_emit_accum_output(&emit->ea);
                /* do not output a newline (indent) if at the end or
                 * this is a leading spaces line */
                if (!fy_is_z(fy_atom_iter_utf8_peek(&iter)) && !leading_spaces)
                    fy_emit_write_indent(emit, indent);
            }

            /* count the number of consecutive breaks */
            nrbreaks = 1;
            while (fy_is_lb(c = fy_atom_iter_utf8_peek(&iter))) {
                nrbreaks++;
                (void) fy_atom_iter_utf8_get(&iter);
            }

            /* NOTE: Because the number of indents is tricky
             * if it's a non blank, non end, it's the number of breaks
             * if it's a blank, it's the number of breaks minus 1
             * if it's the end, it's the number of breaks minus 2
             */
            nrbreakslim = fy_is_z(c) ? 2 : fy_is_blank(c) ? 1 : 0;
            while (nrbreaks-- > nrbreakslim) {
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            }

            breaks = true;

        } else {

            /* if we had a break, output an indent */
            if (breaks) {
                fy_emit_write_indent(emit, indent);

                /* if this line starts with whitespace we need to know */
                leading_spaces = fy_is_ws(c);
            }

            if (!breaks && fy_is_space(c) &&
                !fy_is_space(fy_atom_iter_utf8_peek(&iter)) &&
                fy_emit_accum_column(&emit->ea) > fy_emit_width(emit)) {
                fy_emit_accum_output(&emit->ea);
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);
}